

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

CasePropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CasePropertyExprSyntax,slang::syntax::CasePropertyExprSyntax_const&>
          (BumpAllocator *this,CasePropertyExprSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  Info *pIVar3;
  ExpressionSyntax *pEVar4;
  size_t sVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  CasePropertyExprSyntax *pCVar18;
  
  pCVar18 = (CasePropertyExprSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CasePropertyExprSyntax *)this->endPtr < pCVar18 + 1) {
    pCVar18 = (CasePropertyExprSyntax *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(pCVar18 + 1);
  }
  (pCVar18->super_PropertyExprSyntax).super_SyntaxNode.previewNode =
       (args->super_PropertyExprSyntax).super_SyntaxNode.previewNode;
  uVar6 = *(undefined4 *)&(args->super_PropertyExprSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PropertyExprSyntax).super_SyntaxNode.parent;
  (pCVar18->super_PropertyExprSyntax).super_SyntaxNode.kind =
       (args->super_PropertyExprSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar18->super_PropertyExprSyntax).super_SyntaxNode.field_0x4 = uVar6;
  (pCVar18->super_PropertyExprSyntax).super_SyntaxNode.parent = pSVar1;
  uVar7 = (args->caseKeyword).field_0x2;
  NVar8.raw = (args->caseKeyword).numFlags.raw;
  uVar9 = (args->caseKeyword).rawLen;
  pIVar2 = (args->caseKeyword).info;
  TVar10 = (args->openParen).kind;
  uVar11 = (args->openParen).field_0x2;
  NVar12.raw = (args->openParen).numFlags.raw;
  uVar13 = (args->openParen).rawLen;
  pIVar3 = (args->openParen).info;
  pEVar4 = (args->expr).ptr;
  TVar14 = (args->closeParen).kind;
  uVar15 = (args->closeParen).field_0x2;
  NVar16.raw = (args->closeParen).numFlags.raw;
  uVar17 = (args->closeParen).rawLen;
  (pCVar18->caseKeyword).kind = (args->caseKeyword).kind;
  (pCVar18->caseKeyword).field_0x2 = uVar7;
  (pCVar18->caseKeyword).numFlags = (NumericTokenFlags)NVar8.raw;
  (pCVar18->caseKeyword).rawLen = uVar9;
  (pCVar18->caseKeyword).info = pIVar2;
  (pCVar18->openParen).kind = TVar10;
  (pCVar18->openParen).field_0x2 = uVar11;
  (pCVar18->openParen).numFlags = (NumericTokenFlags)NVar12.raw;
  (pCVar18->openParen).rawLen = uVar13;
  (pCVar18->openParen).info = pIVar3;
  (pCVar18->expr).ptr = pEVar4;
  (pCVar18->closeParen).kind = TVar14;
  (pCVar18->closeParen).field_0x2 = uVar15;
  (pCVar18->closeParen).numFlags = (NumericTokenFlags)NVar16.raw;
  (pCVar18->closeParen).rawLen = uVar17;
  (pCVar18->closeParen).info = (args->closeParen).info;
  (pCVar18->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->items).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar6 = *(undefined4 *)&(args->items).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->items).super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar18->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->items).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar18->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6;
  (pCVar18->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar18->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005c8270;
  (pCVar18->items).super_SyntaxListBase.childCount = (args->items).super_SyntaxListBase.childCount;
  sVar5 = (args->items).super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  (pCVar18->items).super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>.
  _M_ptr = (args->items).super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>
           ._M_ptr;
  (pCVar18->items).super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar5;
  (pCVar18->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005cb738;
  uVar7 = (args->endcase).field_0x2;
  NVar8.raw = (args->endcase).numFlags.raw;
  uVar9 = (args->endcase).rawLen;
  pIVar2 = (args->endcase).info;
  (pCVar18->endcase).kind = (args->endcase).kind;
  (pCVar18->endcase).field_0x2 = uVar7;
  (pCVar18->endcase).numFlags = (NumericTokenFlags)NVar8.raw;
  (pCVar18->endcase).rawLen = uVar9;
  (pCVar18->endcase).info = pIVar2;
  return pCVar18;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }